

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACLoader.cpp
# Opt level: O2

void __thiscall
Assimp::AC3DImporter::LoadObjectSection
          (AC3DImporter *this,
          vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
          *objects)

{
  char **in;
  float fVar1;
  char cVar2;
  vector<aiLight_*,_std::allocator<aiLight_*>_> *this_00;
  pointer paVar3;
  pointer pSVar4;
  pointer ppVar5;
  aiVector2D *paVar6;
  bool bVar7;
  int iVar8;
  ai_uint32 aVar9;
  uint uVar10;
  uint uVar11;
  aiLight *paVar12;
  ulong uVar13;
  Logger *pLVar14;
  char *pcVar15;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 uVar17;
  DeadlyImportError *pDVar16;
  byte *pbVar18;
  Type TVar19;
  uint uVar20;
  long lVar21;
  uint k;
  AC3DImporter *this_01;
  pointer pOVar22;
  byte *pbVar23;
  ai_real aVar24;
  long lStack_190;
  allocator<char> local_185;
  uint local_184;
  AC3DImporter *local_180;
  vector<std::pair<unsigned_int,aiVector2t<float>>,std::allocator<std::pair<unsigned_int,aiVector2t<float>>>>
  *local_178;
  string *local_170;
  uint local_168;
  uint local_164;
  vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *local_160;
  vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_> *local_158;
  string *local_150;
  pointer local_148;
  aiLight *light;
  aiVector2D *local_138;
  aiVector3D *local_130;
  aiMatrix3x3 *local_128;
  aiVector2D *local_120;
  undefined1 local_118 [4];
  float fStack_114;
  float afStack_110 [2];
  undefined1 local_108 [216];
  
  in = &this->buffer;
  bVar7 = TokenMatch<char_const>(in,"OBJECT",6);
  if (bVar7) {
    SkipSpaces<char>(in);
    this->mNumMeshes = this->mNumMeshes + 1;
    local_180 = this;
    Object::Object((Object *)local_118);
    std::vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>::
    emplace_back<Assimp::AC3DImporter::Object>(objects,(Object *)local_118);
    Object::~Object((Object *)local_118);
    pOVar22 = (objects->
              super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    light = (aiLight *)0x0;
    iVar8 = ASSIMP_strincmp(*in,"light",5);
    this_01 = local_180;
    if (iVar8 == 0) {
      this_00 = local_180->mLights;
      paVar12 = (aiLight *)operator_new(0x46c);
      aiLight::aiLight(paVar12);
      light = paVar12;
      std::vector<aiLight_*,_std::allocator<aiLight_*>_>::push_back(this_00,&light);
      light->mType = aiLightSource_POINT;
      (light->mColorSpecular).g = 1.0;
      (light->mColorSpecular).b = 1.0;
      (light->mColorDiffuse).r = 1.0;
      (light->mColorDiffuse).g = 1.0;
      (light->mColorDiffuse).b = 1.0;
      (light->mColorSpecular).r = 1.0;
      light->mAttenuationConstant = 1.0;
      aVar9 = snprintf((light->mName).data,0x400,"ACLight_%i",
                       (ulong)((int)((ulong)((long)(this_01->mLights->
                                                                                                      
                                                  super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(this_01->mLights->
                                                  super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>
                                                  )._M_impl.super__Vector_impl_data._M_start) >> 3)
                              - 1));
      (light->mName).length = aVar9;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_118,(light->mName).data,&local_185);
      TVar19 = Light;
      std::__cxx11::string::operator=((string *)&pOVar22[-1].name,(string *)local_118);
      std::__cxx11::string::~string((string *)local_118);
      pLVar14 = DefaultLogger::get();
      Logger::debug(pLVar14,"AC3D: Light source encountered");
    }
    else {
      iVar8 = ASSIMP_strincmp(*in,"group",5);
      this_01 = local_180;
      if (iVar8 == 0) {
        TVar19 = Group;
      }
      else {
        iVar8 = ASSIMP_strincmp(*in,"world",5);
        TVar19 = (Type)(iVar8 != 0);
      }
    }
    pOVar22[-1].type = TVar19;
    local_158 = &pOVar22[-1].surfaces;
    local_160 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&pOVar22[-1].vertices
    ;
    local_130 = &pOVar22[-1].translation;
    local_128 = &pOVar22[-1].rotation;
    local_120 = &pOVar22[-1].texOffset;
    local_138 = &pOVar22[-1].texRepeat;
    local_150 = (string *)&pOVar22[-1].texture;
    local_170 = (string *)&pOVar22[-1].name;
LAB_003d57bf:
    bVar7 = GetNextLine(this_01);
    if (bVar7) {
      bVar7 = TokenMatch<char_const>(in,"kids",4);
      if (bVar7) {
        SkipSpaces<char>(in);
        uVar10 = strtoul10(this_01->buffer,in);
        GetNextLine(this_01);
        if (uVar10 == 0) {
          return;
        }
        std::vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>::
        reserve(&pOVar22[-1].children,(ulong)uVar10);
        while (bVar7 = uVar10 != 0, uVar10 = uVar10 - 1, bVar7) {
          LoadObjectSection(this_01,&pOVar22[-1].children);
        }
        return;
      }
      bVar7 = TokenMatch<char_const>(in,"name",4);
      if (bVar7) {
        SkipSpaces<char>(in);
        if (**in == '\0') {
          pDVar16 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_118,"AC3D: Unexpected EOF in string",&local_185);
          DeadlyImportError::DeadlyImportError(pDVar16,(string *)local_118);
          __cxa_throw(pDVar16,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        pbVar23 = (byte *)(*in + 1);
        pbVar18 = pbVar23;
LAB_003d581d:
        *in = (char *)pbVar18;
        uVar13 = (ulong)*pbVar18;
        if (uVar13 < 0x23) {
          if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
            pLVar14 = DefaultLogger::get();
            Logger::error(pLVar14,"AC3D: Unexpected EOF/EOL in string");
            std::__cxx11::string::assign((char *)local_170);
            pbVar18 = (byte *)*in;
            if ((*pbVar18 < 0xe) && ((0x3401U >> (*pbVar18 & 0x1f) & 1) != 0)) goto LAB_003d57bf;
LAB_003d58d8:
            _local_118 = local_108;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_118,pbVar23,pbVar23 + (uint)((int)pbVar18 - (int)pbVar23));
            std::__cxx11::string::operator=(local_170,(string *)local_118);
            std::__cxx11::string::~string((string *)local_118);
            paVar12 = light;
            *in = *in + 1;
            if ((light != (aiLight *)0x0) &&
               (uVar13 = pOVar22[-1].name._M_string_length, uVar13 < 0x400)) {
              (light->mName).length = (ai_uint32)uVar13;
              memcpy((light->mName).data,*(void **)local_170,uVar13);
              (paVar12->mName).data[uVar13] = '\0';
            }
            goto LAB_003d57bf;
          }
          if (uVar13 == 0x22) goto LAB_003d58d8;
        }
        pbVar18 = pbVar18 + 1;
        goto LAB_003d581d;
      }
      bVar7 = TokenMatch<char_const>(in,"texture",7);
      if (bVar7) {
        SkipSpaces<char>(in);
        if (**in == '\0') {
          pDVar16 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_118,"AC3D: Unexpected EOF in string",&local_185);
          DeadlyImportError::DeadlyImportError(pDVar16,(string *)local_118);
          __cxa_throw(pDVar16,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        pbVar23 = (byte *)(*in + 1);
        pbVar18 = pbVar23;
LAB_003d5875:
        *in = (char *)pbVar18;
        uVar13 = (ulong)*pbVar18;
        if (uVar13 < 0x23) {
          if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
            pLVar14 = DefaultLogger::get();
            Logger::error(pLVar14,"AC3D: Unexpected EOF/EOL in string");
            std::__cxx11::string::assign((char *)local_150);
            pbVar18 = (byte *)*in;
            if ((*pbVar18 < 0xe) && ((0x3401U >> (*pbVar18 & 0x1f) & 1) != 0)) goto LAB_003d57bf;
LAB_003d5a11:
            _local_118 = local_108;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_118,pbVar23,pbVar23 + (uint)((int)pbVar18 - (int)pbVar23));
            std::__cxx11::string::operator=(local_150,(string *)local_118);
            std::__cxx11::string::~string((string *)local_118);
            *in = *in + 1;
            goto LAB_003d57bf;
          }
          if (uVar13 == 0x22) goto LAB_003d5a11;
        }
        pbVar18 = pbVar18 + 1;
        goto LAB_003d5875;
      }
      bVar7 = TokenMatch<char_const>(in,"texrep",6);
      if (bVar7) {
        SkipSpaces<char>(in);
        bVar7 = SkipSpaces<char>(in);
        paVar6 = local_138;
        if (bVar7) {
          for (lVar21 = 0; lVar21 != 8; lVar21 = lVar21 + 4) {
            bVar7 = SkipSpaces<char>(in);
            if (bVar7) {
              pcVar15 = fast_atoreal_move<float>(*in,(float *)((long)&paVar6->x + lVar21),true);
              *in = pcVar15;
            }
            else {
              pLVar14 = DefaultLogger::get();
              Logger::error(pLVar14,"AC3D: Unexpected EOF/EOL");
            }
          }
          fVar1 = pOVar22[-1].texRepeat.x;
          if (((fVar1 == 0.0) && (!NAN(fVar1))) ||
             ((fVar1 = pOVar22[-1].texRepeat.y, fVar1 == 0.0 && (!NAN(fVar1))))) {
            pOVar22[-1].texRepeat.x = 1.0;
            pOVar22[-1].texRepeat.y = 1.0;
          }
        }
        else {
LAB_003d5bf3:
          pLVar14 = DefaultLogger::get();
          Logger::error(pLVar14,"AC3D: Unexpected EOF/EOL");
        }
      }
      else {
        bVar7 = TokenMatch<char_const>(in,"texoff",6);
        if (bVar7) {
          SkipSpaces<char>(in);
          bVar7 = SkipSpaces<char>(in);
          if (!bVar7) goto LAB_003d5bf3;
          for (lVar21 = 0; lVar21 != 8; lVar21 = lVar21 + 4) {
            bVar7 = SkipSpaces<char>(in);
            if (bVar7) {
              pcVar15 = fast_atoreal_move<float>(*in,(float *)((long)&local_120->x + lVar21),true);
              *in = pcVar15;
            }
            else {
              pLVar14 = DefaultLogger::get();
              Logger::error(pLVar14,"AC3D: Unexpected EOF/EOL");
            }
          }
        }
        else {
          bVar7 = TokenMatch<char_const>(in,"rot",3);
          if (bVar7) {
            SkipSpaces<char>(in);
            bVar7 = SkipSpaces<char>(in);
            if (!bVar7) goto LAB_003d5bf3;
            for (lVar21 = 0; lVar21 != 0x24; lVar21 = lVar21 + 4) {
              bVar7 = SkipSpaces<char>(in);
              if (bVar7) {
                pcVar15 = fast_atoreal_move<float>
                                    (*in,(float *)((long)&local_128->a1 + lVar21),true);
                *in = pcVar15;
              }
              else {
                pLVar14 = DefaultLogger::get();
                Logger::error(pLVar14,"AC3D: Unexpected EOF/EOL");
              }
            }
          }
          else {
            bVar7 = TokenMatch<char_const>(in,"loc",3);
            if (bVar7) {
              SkipSpaces<char>(in);
              bVar7 = SkipSpaces<char>(in);
              if (!bVar7) goto LAB_003d5bf3;
              for (lVar21 = 0; lVar21 != 0xc; lVar21 = lVar21 + 4) {
                bVar7 = SkipSpaces<char>(in);
                if (bVar7) {
                  pcVar15 = fast_atoreal_move<float>
                                      (*in,(float *)((long)&local_130->x + lVar21),true);
                  *in = pcVar15;
                }
                else {
                  pLVar14 = DefaultLogger::get();
                  Logger::error(pLVar14,"AC3D: Unexpected EOF/EOL");
                }
              }
            }
            else {
              bVar7 = TokenMatch<char_const>(in,"subdiv",6);
              if (bVar7) {
                SkipSpaces<char>(in);
                uVar10 = strtoul10(*in,in);
                pOVar22[-1].subDiv = uVar10;
              }
              else {
                bVar7 = TokenMatch<char_const>(in,"crease",6);
                if (bVar7) {
                  SkipSpaces<char>(in);
                  aVar24 = fast_atof(*in);
                  pOVar22[-1].crease = aVar24;
                }
                else {
                  bVar7 = TokenMatch<char_const>(in,"numvert",7);
                  if (bVar7) {
                    SkipSpaces<char>(in);
                    uVar10 = strtoul10(*in,in);
                    if (0x1555554 < uVar10) {
                      pDVar16 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)local_118,
                                 "AC3D: Too many vertices, would run out of memory",&local_185);
                      DeadlyImportError::DeadlyImportError(pDVar16,(string *)local_118);
                      __cxa_throw(pDVar16,&DeadlyImportError::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                               local_160,(ulong)uVar10);
                    local_178 = (vector<std::pair<unsigned_int,aiVector2t<float>>,std::allocator<std::pair<unsigned_int,aiVector2t<float>>>>
                                 *)CONCAT44(local_178._4_4_,uVar10);
                    for (uVar20 = 0; uVar20 != uVar10; uVar20 = uVar20 + 1) {
                      bVar7 = GetNextLine(this_01);
                      if (!bVar7) {
                        pLVar14 = DefaultLogger::get();
                        Logger::error(pLVar14,
                                      "AC3D: Unexpected EOF: not all vertices have been parsed yet")
                        ;
                        break;
                      }
                      cVar2 = **in;
                      if (((9 < (byte)(cVar2 - 0x30U)) && (cVar2 != '+')) && (cVar2 != '-')) {
                        pLVar14 = DefaultLogger::get();
                        Logger::error(pLVar14,
                                      "AC3D: Unexpected token: not all vertices have been parsed yet"
                                     );
                        *in = *in + -1;
                        break;
                      }
                      local_118 = (undefined1  [4])0x0;
                      fStack_114 = 0.0;
                      afStack_110[0] = 0.0;
                      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
                      emplace_back<aiVector3t<float>>(local_160,(aiVector3t<float> *)local_118);
                      paVar3 = pOVar22[-1].vertices.
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                      bVar7 = SkipSpaces<char>(in);
                      if (bVar7) {
                        for (lVar21 = -0xc; lVar21 != 0; lVar21 = lVar21 + 4) {
                          bVar7 = SkipSpaces<char>(in);
                          if (bVar7) {
                            pcVar15 = fast_atoreal_move<float>
                                                (*in,(float *)((long)&paVar3->x + lVar21),true);
                            *in = pcVar15;
                          }
                          else {
                            pLVar14 = DefaultLogger::get();
                            Logger::error(pLVar14,"AC3D: Unexpected EOF/EOL");
                          }
                        }
                      }
                      else {
                        pLVar14 = DefaultLogger::get();
                        Logger::error(pLVar14,"AC3D: Unexpected EOF/EOL");
                      }
                      this_01 = local_180;
                      uVar10 = (uint)local_178;
                    }
                  }
                  else {
                    bVar7 = TokenMatch<char_const>(in,"numsurf",7);
                    if (bVar7) {
                      SkipSpaces<char>(in);
                      local_168 = strtoul10(*in,in);
                      std::
                      vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
                      ::reserve(local_158,(ulong)local_168);
                      local_184 = 0;
                      uVar10 = 0;
                      local_148 = pOVar22;
                      while (pOVar22 = local_148, uVar10 != local_168) {
                        local_164 = uVar10;
                        GetNextLine(this_01);
                        bVar7 = TokenMatch<char_const>(in,"SURF",4);
                        if (!bVar7) {
                          uVar17 = extraout_var;
                          if ((local_184 & 1) == 0) {
                            pLVar14 = DefaultLogger::get();
                            Logger::warn(pLVar14,"AC3D: SURF token was expected");
                            pLVar14 = DefaultLogger::get();
                            Logger::debug(pLVar14,"Continuing with Quick3D Workaround enabled");
                            uVar17 = extraout_var_00;
                          }
                          *in = *in + -1;
                          local_184 = (uint)CONCAT71(uVar17,1);
                        }
                        SkipSpaces<char>(in);
                        local_108._0_8_ = (pointer)0x0;
                        local_108._8_8_ = 0;
                        local_118 = (undefined1  [4])0x0;
                        fStack_114 = 0.0;
                        afStack_110[0] = 0.0;
                        afStack_110[1] = 0.0;
                        std::
                        vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
                        ::emplace_back<Assimp::AC3DImporter::Surface>
                                  (local_158,(Surface *)local_118);
                        std::
                        _Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                        ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                         *)afStack_110);
                        pSVar4 = pOVar22[-1].surfaces.
                                 super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                        uVar10 = strtoul_cppstyle(*in,(char **)0x0);
                        pSVar4[-1].flags = uVar10;
                        local_178 = (vector<std::pair<unsigned_int,aiVector2t<float>>,std::allocator<std::pair<unsigned_int,aiVector2t<float>>>>
                                     *)&pSVar4[-1].entries;
LAB_003d5e88:
                        while( true ) {
                          bVar7 = GetNextLine(this_01);
                          if (!bVar7) {
                            pDVar16 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)local_118,
                                       "AC3D: Unexpected EOF: surface is incomplete",&local_185);
                            DeadlyImportError::DeadlyImportError(pDVar16,(string *)local_118);
                            __cxa_throw(pDVar16,&DeadlyImportError::typeinfo,
                                        std::runtime_error::~runtime_error);
                          }
                          bVar7 = TokenMatch<char_const>(in,"mat",3);
                          if (!bVar7) break;
                          SkipSpaces<char>(in);
                          uVar10 = strtoul10(*in,(char **)0x0);
                          pSVar4[-1].mat = uVar10;
                        }
                        bVar7 = TokenMatch<char_const>(in,"refs",4);
                        if (!bVar7) {
                          lStack_190 = -1;
                          goto LAB_003d5ffc;
                        }
                        if (((local_184 & 1) == 0) ||
                           (pSVar4[-1].entries.
                            super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start ==
                            pSVar4[-1].entries.
                            super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish)) {
                          SkipSpaces<char>(in);
                          uVar10 = strtoul10(*in,(char **)0x0);
                          std::
                          vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                          ::reserve((vector<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                     *)local_178,(ulong)uVar10);
                          local_148[-1].numRefs = local_148[-1].numRefs + uVar10;
                          for (uVar20 = 0; uVar20 != uVar10; uVar20 = uVar20 + 1) {
                            bVar7 = GetNextLine(this_01);
                            if (!bVar7) {
                              pLVar14 = DefaultLogger::get();
                              Logger::error(pLVar14,
                                            "AC3D: Unexpected EOF: surface references are incomplete"
                                           );
                              break;
                            }
                            local_118 = (undefined1  [4])0x0;
                            fStack_114 = 0.0;
                            afStack_110[0] = 0.0;
                            std::
                            vector<std::pair<unsigned_int,aiVector2t<float>>,std::allocator<std::pair<unsigned_int,aiVector2t<float>>>>
                            ::emplace_back<std::pair<unsigned_int,aiVector2t<float>>>
                                      (local_178,(pair<unsigned_int,_aiVector2t<float>_> *)local_118
                                      );
                            ppVar5 = pSVar4[-1].entries.
                                     super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
                            uVar11 = strtoul10(*in,in);
                            ppVar5[-1].first = uVar11;
                            SkipSpaces<char>(in);
                            bVar7 = SkipSpaces<char>(in);
                            if (bVar7) {
                              for (lVar21 = -8; lVar21 != 0; lVar21 = lVar21 + 4) {
                                bVar7 = SkipSpaces<char>(in);
                                if (bVar7) {
                                  pcVar15 = fast_atoreal_move<float>
                                                      (*in,(float *)((long)&ppVar5->first + lVar21),
                                                       true);
                                  *in = pcVar15;
                                }
                                else {
                                  pLVar14 = DefaultLogger::get();
                                  Logger::error(pLVar14,"AC3D: Unexpected EOF/EOL");
                                }
                              }
                            }
                            else {
                              pLVar14 = DefaultLogger::get();
                              Logger::error(pLVar14,"AC3D: Unexpected EOF/EOL");
                            }
                            this_01 = local_180;
                          }
                          goto LAB_003d5e88;
                        }
                        lStack_190 = -6;
LAB_003d5ffc:
                        *in = *in + lStack_190;
                        uVar10 = local_164 + 1;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      goto LAB_003d57bf;
    }
    pLVar14 = DefaultLogger::get();
    Logger::error(pLVar14,"AC3D: Unexpected EOF: \'kids\' line was expected");
  }
  return;
}

Assistant:

void AC3DImporter::LoadObjectSection(std::vector<Object>& objects)
{
    if (!TokenMatch(buffer,"OBJECT",6))
        return;

    SkipSpaces(&buffer);

    ++mNumMeshes;

    objects.push_back(Object());
    Object& obj = objects.back();

    aiLight* light = NULL;
    if (!ASSIMP_strincmp(buffer,"light",5))
    {
        // This is a light source. Add it to the list
        mLights->push_back(light = new aiLight());

        // Return a point light with no attenuation
        light->mType = aiLightSource_POINT;
        light->mColorDiffuse = light->mColorSpecular = aiColor3D(1.f,1.f,1.f);
        light->mAttenuationConstant = 1.f;

        // Generate a default name for both the light source and the node
        // FIXME - what's the right way to print a size_t? Is 'zu' universally available? stick with the safe version.
        light->mName.length = ::ai_snprintf(light->mName.data, MAXLEN, "ACLight_%i",static_cast<unsigned int>(mLights->size())-1);
        obj.name = std::string( light->mName.data );

        ASSIMP_LOG_DEBUG("AC3D: Light source encountered");
        obj.type = Object::Light;
    }
    else if (!ASSIMP_strincmp(buffer,"group",5))
    {
        obj.type = Object::Group;
    }
    else if (!ASSIMP_strincmp(buffer,"world",5))
    {
        obj.type = Object::World;
    }
    else obj.type = Object::Poly;
    while (GetNextLine())
    {
        if (TokenMatch(buffer,"kids",4))
        {
            SkipSpaces(&buffer);
            unsigned int num = strtoul10(buffer,&buffer);
            GetNextLine();
            if (num)
            {
                // load the children of this object recursively
                obj.children.reserve(num);
                for (unsigned int i = 0; i < num; ++i)
                    LoadObjectSection(obj.children);
            }
            return;
        }
        else if (TokenMatch(buffer,"name",4))
        {
            SkipSpaces(&buffer);
            AI_AC_GET_STRING(obj.name);

            // If this is a light source, we'll also need to store
            // the name of the node in it.
            if (light)
            {
                light->mName.Set(obj.name);
            }
        }
        else if (TokenMatch(buffer,"texture",7))
        {
            SkipSpaces(&buffer);
            AI_AC_GET_STRING(obj.texture);
        }
        else if (TokenMatch(buffer,"texrep",6))
        {
            SkipSpaces(&buffer);
            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("",0,2,&obj.texRepeat);
            if (!obj.texRepeat.x || !obj.texRepeat.y)
                obj.texRepeat = aiVector2D (1.f,1.f);
        }
        else if (TokenMatch(buffer,"texoff",6))
        {
            SkipSpaces(&buffer);
            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("",0,2,&obj.texOffset);
        }
        else if (TokenMatch(buffer,"rot",3))
        {
            SkipSpaces(&buffer);
            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("",0,9,&obj.rotation);
        }
        else if (TokenMatch(buffer,"loc",3))
        {
            SkipSpaces(&buffer);
            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("",0,3,&obj.translation);
        }
        else if (TokenMatch(buffer,"subdiv",6))
        {
            SkipSpaces(&buffer);
            obj.subDiv = strtoul10(buffer,&buffer);
        }
        else if (TokenMatch(buffer,"crease",6))
        {
            SkipSpaces(&buffer);
            obj.crease = fast_atof(buffer);
        }
        else if (TokenMatch(buffer,"numvert",7))
        {
            SkipSpaces(&buffer);

            unsigned int t = strtoul10(buffer,&buffer);
            if (t >= AI_MAX_ALLOC(aiVector3D)) {
                throw DeadlyImportError("AC3D: Too many vertices, would run out of memory");
            }
            obj.vertices.reserve(t);
            for (unsigned int i = 0; i < t;++i)
            {
                if (!GetNextLine())
                {
                    ASSIMP_LOG_ERROR("AC3D: Unexpected EOF: not all vertices have been parsed yet");
                    break;
                }
                else if (!IsNumeric(*buffer))
                {
                    ASSIMP_LOG_ERROR("AC3D: Unexpected token: not all vertices have been parsed yet");
                    --buffer; // make sure the line is processed a second time
                    break;
                }
                obj.vertices.push_back(aiVector3D());
                aiVector3D& v = obj.vertices.back();
                AI_AC_CHECKED_LOAD_FLOAT_ARRAY("",0,3,&v.x);
            }
        }
        else if (TokenMatch(buffer,"numsurf",7))
        {
            SkipSpaces(&buffer);

            bool Q3DWorkAround = false;

            const unsigned int t = strtoul10(buffer,&buffer);
            obj.surfaces.reserve(t);
            for (unsigned int i = 0; i < t;++i)
            {
                GetNextLine();
                if (!TokenMatch(buffer,"SURF",4))
                {
                    // FIX: this can occur for some files - Quick 3D for
                    // example writes no surf chunks
                    if (!Q3DWorkAround)
                    {
                        ASSIMP_LOG_WARN("AC3D: SURF token was expected");
                        ASSIMP_LOG_DEBUG("Continuing with Quick3D Workaround enabled");
                    }
                    --buffer; // make sure the line is processed a second time
                    // break; --- see fix notes above

                    Q3DWorkAround = true;
                }
                SkipSpaces(&buffer);
                obj.surfaces.push_back(Surface());
                Surface& surf = obj.surfaces.back();
                surf.flags = strtoul_cppstyle(buffer);

                while (1)
                {
                    if(!GetNextLine())
                    {
                        throw DeadlyImportError("AC3D: Unexpected EOF: surface is incomplete");
                    }
                    if (TokenMatch(buffer,"mat",3))
                    {
                        SkipSpaces(&buffer);
                        surf.mat = strtoul10(buffer);
                    }
                    else if (TokenMatch(buffer,"refs",4))
                    {
                        // --- see fix notes above
                        if (Q3DWorkAround)
                        {
                            if (!surf.entries.empty())
                            {
                                buffer -= 6;
                                break;
                            }
                        }

                        SkipSpaces(&buffer);
                        const unsigned int m = strtoul10(buffer);
                        surf.entries.reserve(m);

                        obj.numRefs += m;

                        for (unsigned int k = 0; k < m; ++k)
                        {
                            if(!GetNextLine())
                            {
                                ASSIMP_LOG_ERROR("AC3D: Unexpected EOF: surface references are incomplete");
                                break;
                            }
                            surf.entries.push_back(Surface::SurfaceEntry());
                            Surface::SurfaceEntry& entry = surf.entries.back();

                            entry.first = strtoul10(buffer,&buffer);
                            SkipSpaces(&buffer);
                            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("",0,2,&entry.second);
                        }
                    }
                    else
                    {

                        --buffer; // make sure the line is processed a second time
                        break;
                    }
                }
            }
        }
    }
    ASSIMP_LOG_ERROR("AC3D: Unexpected EOF: \'kids\' line was expected");
}